

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

uint __thiscall crnlib::command_line_params::get_count(command_line_params *this,char *pKey)

{
  bool bVar1;
  uint local_2c;
  uint n;
  param_map_const_iterator end;
  param_map_const_iterator begin;
  char *pKey_local;
  command_line_params *this_local;
  
  std::
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  ::_Rb_tree_const_iterator(&end);
  std::
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
              *)&stack0xffffffffffffffd8);
  find(this,pKey,&end,(param_map_const_iterator *)&stack0xffffffffffffffd8);
  local_2c = 0;
  while( true ) {
    bVar1 = std::operator!=(&end,(_Self *)&stack0xffffffffffffffd8);
    if (!bVar1) break;
    local_2c = local_2c + 1;
    std::
    _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
    ::operator++(&end,0);
  }
  return local_2c;
}

Assistant:

uint command_line_params::get_count(const char* pKey) const
    {
        param_map_const_iterator begin, end;
        find(pKey, begin, end);

        uint n = 0;

        while (begin != end)
        {
            n++;
            begin++;
        }

        return n;
    }